

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2.c
# Opt level: O0

int argon2_ctx_mem(argon2_context *context,argon2_type type,void *memory,size_t memory_size)

{
  undefined1 local_78 [8];
  argon2_instance_t instance;
  uint local_38;
  uint32_t segment_length;
  uint32_t memory_blocks;
  int result;
  size_t memory_size_local;
  void *memory_local;
  argon2_context *paStack_18;
  argon2_type type_local;
  argon2_context *context_local;
  
  _memory_blocks = memory_size;
  memory_size_local = (size_t)memory;
  memory_local._4_4_ = type;
  paStack_18 = context;
  segment_length = validate_inputs(context);
  context_local._4_4_ = segment_length;
  if (segment_length == 0) {
    if (((memory_local._4_4_ == Argon2_d) || (memory_local._4_4_ == Argon2_i)) ||
       (memory_local._4_4_ == Argon2_id)) {
      argon2_compute_memory_blocks
                (&local_38,(uint32_t *)((long)&instance.context_ptr + 4),paStack_18->m_cost,
                 paStack_18->lanes);
      if ((memory_size_local == 0) ||
         (((_memory_blocks & 0x3ff) == 0 && ((ulong)local_38 <= _memory_blocks >> 10)))) {
        instance.memory._0_4_ = paStack_18->version;
        local_78 = (undefined1  [8])memory_size_local;
        instance.memory._4_4_ = paStack_18->t_cost;
        instance.version = local_38;
        instance.passes = instance.context_ptr._4_4_;
        instance.memory_blocks = instance.context_ptr._4_4_ << 2;
        instance.segment_length = paStack_18->lanes;
        instance.lane_length = paStack_18->threads;
        instance.lanes = memory_local._4_4_;
        instance.threads = (uint32_t)((paStack_18->flags & 8) != 0);
        instance.type = (argon2_type)(memory_size_local != 0);
        if (instance.segment_length < instance.lane_length) {
          instance.lane_length = instance.segment_length;
        }
        segment_length = initialize((argon2_instance_t *)local_78,paStack_18);
        context_local._4_4_ = segment_length;
        if ((segment_length == 0) &&
           (segment_length = fill_memory_blocks((argon2_instance_t *)local_78),
           context_local._4_4_ = segment_length, segment_length == 0)) {
          finalize(paStack_18,(argon2_instance_t *)local_78);
          context_local._4_4_ = 0;
        }
      }
      else {
        context_local._4_4_ = 0xffffffea;
      }
    }
    else {
      context_local._4_4_ = 0xffffffe6;
    }
  }
  return context_local._4_4_;
}

Assistant:

int argon2_ctx_mem(argon2_context *context, argon2_type type, void *memory,
                   size_t memory_size) {
    /* 1. Validate all inputs */
    int result = validate_inputs(context);
    uint32_t memory_blocks, segment_length;
    argon2_instance_t instance;

    if (ARGON2_OK != result) {
        return result;
    }

    if (Argon2_d != type && Argon2_i != type && Argon2_id != type) {
        return ARGON2_INCORRECT_TYPE;
    }

    /* 2. Align memory size */
    argon2_compute_memory_blocks(&memory_blocks, &segment_length,
                                 context->m_cost, context->lanes);

    /* check for sufficient memory size: */
    if (memory != NULL && (memory_size % ARGON2_BLOCK_SIZE != 0 ||
                           memory_size / ARGON2_BLOCK_SIZE < memory_blocks)) {
        return ARGON2_MEMORY_ALLOCATION_ERROR;
    }

    instance.version = context->version;
    instance.memory = (block *)memory;
    instance.passes = context->t_cost;
    instance.memory_blocks = memory_blocks;
    instance.segment_length = segment_length;
    instance.lane_length = segment_length * ARGON2_SYNC_POINTS;
    instance.lanes = context->lanes;
    instance.threads = context->threads;
    instance.type = type;
    instance.print_internals = !!(context->flags & ARGON2_FLAG_GENKAT);
    instance.keep_memory = memory != NULL;

    if (instance.threads > instance.lanes) {
        instance.threads = instance.lanes;
    }

    /* 3. Initialization: Hashing inputs, allocating memory, filling first
     * blocks
     */
    result = initialize(&instance, context);

    if (ARGON2_OK != result) {
        return result;
    }

    /* 4. Filling memory */
    result = fill_memory_blocks(&instance);

    if (ARGON2_OK != result) {
        return result;
    }
    /* 5. Finalization */
    finalize(context, &instance);

    return ARGON2_OK;
}